

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O3

bool tinyusdz::VariantSelectPrimSpec
               (PrimSpec *dst,PrimSpec *src,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variant_selection,string *warn,string *err)

{
  _Rb_tree_header *p_Var1;
  PrimSpec *pPVar2;
  _Rb_tree_node_base *p_Var3;
  PrimSpec *pPVar4;
  bool bVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  long lVar12;
  ostream *poVar13;
  long lVar14;
  PrimSpec *extraout_RDX;
  PrimSpec *extraout_RDX_00;
  PrimSpec *extraout_RDX_01;
  PrimSpec *extraout_RDX_02;
  undefined8 extraout_RDX_03;
  PrimSpec *extraout_RDX_04;
  PrimSpec *extraout_RDX_05;
  PrimSpec *extraout_RDX_06;
  PrimSpec *extraout_RDX_07;
  PrimSpec *extraout_RDX_08;
  PrimSpec *extraout_RDX_09;
  PrimSpec *extraout_RDX_10;
  PrimSpec *src_00;
  PrimSpec *extraout_RDX_11;
  PrimSpec *extraout_RDX_12;
  PrimSpec *extraout_RDX_13;
  key_type *__k;
  PrimSpec *pPVar15;
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  __it;
  string *err_00;
  PrimSpec *child;
  PrimSpec *__x;
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  this;
  long lVar16;
  undefined1 auVar17 [16];
  string variantName;
  PrimSpec ps;
  long *local_730;
  long local_720 [2];
  string local_710 [3];
  ios_base local_6a0 [264];
  PrimSpec local_598;
  
  bVar5 = (src->_metas).variantSets.has_value_;
  if ((src->_metas).variants.has_value_ == true) {
    if (bVar5 != false) {
      err_00 = err;
      if (dst != src) {
        PrimSpec::CopyFrom(dst,src);
      }
      PrimSpec::PrimSpec(&local_598,src);
      lVar14 = *(long *)((long)&(src->_metas).variantSets.contained + 0x10) -
               *(long *)((long)&(src->_metas).variantSets.contained + 8) >> 5;
      src_00 = extraout_RDX;
      if (0 < lVar14) {
        do {
          local_710[0]._M_dataplus._M_p = (pointer)&local_710[0].field_2;
          __k = (key_type *)
                ((lVar14 + -1) * 0x20 + *(long *)((long)&(src->_metas).variantSets.contained + 8));
          local_710[0]._M_string_length = 0;
          local_710[0].field_2._M_local_buf[0] = '\0';
          cVar6 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(&variant_selection->_M_t,__k);
          if ((_Rb_tree_header *)cVar6._M_node ==
              &(variant_selection->_M_t)._M_impl.super__Rb_tree_header) {
            bVar5 = PrimSpec::current_variant_selection(dst,__k,local_710);
            src_00 = extraout_RDX_00;
            if (bVar5) goto LAB_001b3970;
          }
          else {
            ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at(variant_selection,__k);
            ::std::__cxx11::string::_M_assign((string *)local_710);
LAB_001b3970:
            cVar7 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                    ::find(&(dst->_variantSets)._M_t,__k);
            src_00 = extraout_RDX_01;
            if ((_Rb_tree_header *)cVar7._M_node !=
                &(dst->_variantSets)._M_t._M_impl.super__Rb_tree_header) {
              pmVar8 = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                       ::at(&dst->_variantSets,__k);
              cVar9 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                      ::find(&(pmVar8->variantSet)._M_t,local_710);
              src_00 = extraout_RDX_02;
              if ((_Rb_tree_header *)cVar9._M_node !=
                  &(pmVar8->variantSet)._M_t._M_impl.super__Rb_tree_header) {
                pmVar10 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                          ::at(&pmVar8->variantSet,local_710);
                PrimMetas::update_from(&local_598._metas,&pmVar10->_metas,true);
                auVar17._8_8_ = extraout_RDX_03;
                auVar17._0_8_ =
                     (pmVar10->_props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                while( true ) {
                  src_00 = auVar17._8_8_;
                  p_Var3 = auVar17._0_8_;
                  if ((_Rb_tree_header *)p_Var3 ==
                      &(pmVar10->_props)._M_t._M_impl.super__Rb_tree_header) break;
                  pmVar11 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                            ::operator[](&local_598._props,(key_type *)(p_Var3 + 1));
                  ::std::__cxx11::string::_M_assign((string *)pmVar11);
                  (pmVar11->_attrib)._varying_authored = (bool)p_Var3[3].field_0x4;
                  (pmVar11->_attrib)._variability = p_Var3[3]._M_color;
                  ::std::__cxx11::string::_M_assign((string *)&(pmVar11->_attrib)._type_name);
                  linb::any::operator=((any *)&(pmVar11->_attrib)._var,(any *)&p_Var3[4]._M_parent);
                  (pmVar11->_attrib)._var._blocked = SUB41(p_Var3[5]._M_color,0);
                  ::std::
                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ::operator=(&(pmVar11->_attrib)._var._ts._samples,
                              (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               *)&p_Var3[5]._M_parent);
                  (pmVar11->_attrib)._var._ts._dirty = SUB41(p_Var3[6]._M_color,0);
                  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                            (&(pmVar11->_attrib)._paths,
                             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                             &p_Var3[6]._M_parent);
                  AttrMetas::operator=(&(pmVar11->_attrib)._metas,(AttrMetas *)(p_Var3 + 7));
                  *(_Base_ptr *)&pmVar11->_listOpQual = p_Var3[0x17]._M_parent;
                  (pmVar11->_rel).type = *(Type *)&p_Var3[0x17]._M_left;
                  Path::operator=(&(pmVar11->_rel).targetPath,(Path *)&p_Var3[0x17]._M_right);
                  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                            (&(pmVar11->_rel).targetPathVector,
                             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                             &p_Var3[0x1e]._M_parent);
                  (pmVar11->_rel).listOpQual = p_Var3[0x1f]._M_color;
                  AttrMetas::operator=(&(pmVar11->_rel)._metas,(AttrMetas *)&p_Var3[0x1f]._M_parent)
                  ;
                  (pmVar11->_rel)._varying_authored = *(bool *)&p_Var3[0x2f]._M_left;
                  ::std::__cxx11::string::_M_assign((string *)&pmVar11->_prop_value_type_name);
                  pmVar11->_has_custom = *(bool *)&p_Var3[0x30]._M_right;
                  auVar17 = ::std::_Rb_tree_increment(p_Var3);
                }
                pPVar2 = (pmVar10->_children).
                         super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                __it._M_current =
                     local_598._children.
                     super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                pPVar4 = local_598._children.
                         super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (__x = (pmVar10->_children).
                           super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                    local_598._children.
                    super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
                    _M_impl.super__Vector_impl_data._M_start = __it._M_current,
                    local_598._children.
                    super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
                    _M_impl.super__Vector_impl_data._M_finish = pPVar4, __x != pPVar2; __x = __x + 1
                    ) {
                  lVar12 = (long)pPVar4 - (long)__it._M_current;
                  lVar16 = (lVar12 >> 3) * -0x77dc7c4cf2ae9cdb >> 2;
                  if (0 < lVar16) {
                    pPVar15 = __it._M_current + lVar16 * 4;
                    lVar16 = lVar16 + 1;
                    do {
                      bVar5 = __gnu_cxx::__ops::
                              _Iter_pred<tinyusdz::VariantSelectPrimSpec(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                              ::operator()((_Iter_pred<tinyusdz::VariantSelectPrimSpec(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                            *)__x,__it);
                      src_00 = extraout_RDX_04;
                      this._M_current = __it._M_current;
                      if (bVar5) goto LAB_001b3c96;
                      bVar5 = __gnu_cxx::__ops::
                              _Iter_pred<tinyusdz::VariantSelectPrimSpec(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                              ::operator()((_Iter_pred<tinyusdz::VariantSelectPrimSpec(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                            *)__x,__it._M_current + 1);
                      src_00 = extraout_RDX_05;
                      this._M_current = __it._M_current + 1;
                      if (bVar5) goto LAB_001b3c96;
                      bVar5 = __gnu_cxx::__ops::
                              _Iter_pred<tinyusdz::VariantSelectPrimSpec(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                              ::operator()((_Iter_pred<tinyusdz::VariantSelectPrimSpec(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                            *)__x,__it._M_current + 2);
                      src_00 = extraout_RDX_06;
                      this._M_current = __it._M_current + 2;
                      if (bVar5) goto LAB_001b3c96;
                      bVar5 = __gnu_cxx::__ops::
                              _Iter_pred<tinyusdz::VariantSelectPrimSpec(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                              ::operator()((_Iter_pred<tinyusdz::VariantSelectPrimSpec(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                            *)__x,__it._M_current + 3);
                      src_00 = extraout_RDX_07;
                      this._M_current = __it._M_current + 3;
                      if (bVar5) goto LAB_001b3c96;
                      __it._M_current = __it._M_current + 4;
                      lVar16 = lVar16 + -1;
                    } while (1 < lVar16);
                    lVar12 = (long)pPVar4 - (long)pPVar15;
                    __it._M_current = pPVar15;
                  }
                  lVar12 = (lVar12 >> 3) * -0x77dc7c4cf2ae9cdb;
                  if (lVar12 == 1) {
LAB_001b3c7d:
                    bVar5 = __gnu_cxx::__ops::
                            _Iter_pred<tinyusdz::VariantSelectPrimSpec(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                            ::operator()((_Iter_pred<tinyusdz::VariantSelectPrimSpec(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                          *)__x,__it);
                    src_00 = extraout_RDX_10;
                    this._M_current = __it._M_current;
                    if (!bVar5) {
                      this._M_current = pPVar4;
                    }
LAB_001b3c96:
                    if (this._M_current == pPVar4) goto LAB_001b3cad;
                    if (this._M_current != __x) {
                      PrimSpec::CopyFrom(this._M_current,__x);
                      src_00 = extraout_RDX_11;
                    }
                  }
                  else {
                    if (lVar12 == 2) {
LAB_001b3c67:
                      bVar5 = __gnu_cxx::__ops::
                              _Iter_pred<tinyusdz::VariantSelectPrimSpec(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                              ::operator()((_Iter_pred<tinyusdz::VariantSelectPrimSpec(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                            *)__x,__it);
                      src_00 = extraout_RDX_09;
                      this._M_current = __it._M_current;
                      if (!bVar5) {
                        __it._M_current = __it._M_current + 1;
                        goto LAB_001b3c7d;
                      }
                      goto LAB_001b3c96;
                    }
                    if (lVar12 == 3) {
                      bVar5 = __gnu_cxx::__ops::
                              _Iter_pred<tinyusdz::VariantSelectPrimSpec(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                              ::operator()((_Iter_pred<tinyusdz::VariantSelectPrimSpec(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                                            *)__x,__it);
                      src_00 = extraout_RDX_08;
                      this._M_current = __it._M_current;
                      if (!bVar5) {
                        __it._M_current = __it._M_current + 1;
                        goto LAB_001b3c67;
                      }
                      goto LAB_001b3c96;
                    }
LAB_001b3cad:
                    ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::
                    push_back(&local_598._children,__x);
                    src_00 = extraout_RDX_12;
                  }
                  __it._M_current =
                       local_598._children.
                       super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  pPVar4 = local_598._children.
                           super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                }
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_710[0]._M_dataplus._M_p != &local_710[0].field_2) {
            operator_delete(local_710[0]._M_dataplus._M_p,
                            CONCAT71(local_710[0].field_2._M_allocated_capacity._1_7_,
                                     local_710[0].field_2._M_local_buf[0]) + 1);
            src_00 = extraout_RDX_13;
          }
          bVar5 = 1 < lVar14;
          lVar14 = lVar14 + -1;
        } while (bVar5);
      }
      local_598._specifier = Over;
      bVar5 = OverridePrimSpec((tinyusdz *)dst,&local_598,src_00,err,err_00);
      if (bVar5) {
        if ((dst->_metas).variants.has_value_ == true) {
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&(dst->_metas).variants.contained,
                     *(_Link_type *)((long)&(dst->_metas).variants.contained + 0x10));
        }
        (dst->_metas).variants.has_value_ = false;
        if ((dst->_metas).variantSets.has_value_ == true) {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&(dst->_metas).variantSets.contained + 8));
        }
        (dst->_metas).variantSets.has_value_ = false;
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
        ::_M_erase(&(dst->_variantSets)._M_t,
                   (_Link_type)
                   (dst->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        p_Var1 = &(dst->_variantSets)._M_t._M_impl.super__Rb_tree_header;
        (dst->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        (dst->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var1->_M_header;
        (dst->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var1->_M_header;
        (dst->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_710,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_710,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_710,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_710,"VariantSelectPrimSpec",0x15);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_710,"():",3);
        poVar13 = (ostream *)::std::ostream::operator<<(local_710,0x6ad);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_710,"Failed to override PrimSpec.",0x1c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_710,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_730);
          if (local_730 != local_720) {
            operator_delete(local_730,local_720[0] + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
        ::std::ios_base::~ios_base(local_6a0);
      }
      PrimSpec::~PrimSpec(&local_598);
      return bVar5;
    }
  }
  else if (bVar5 == false) {
    if (dst == src) {
      return true;
    }
    PrimSpec::CopyFrom(dst,src);
    return true;
  }
  if (warn != (string *)0x0) {
    ::std::__cxx11::string::append((char *)warn);
  }
  if (dst != src) {
    PrimSpec::CopyFrom(dst,src);
  }
  if ((dst->_metas).variants.has_value_ == true) {
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&(dst->_metas).variants.contained,
               *(_Link_type *)((long)&(dst->_metas).variants.contained + 0x10));
  }
  (dst->_metas).variants.has_value_ = false;
  if ((dst->_metas).variantSets.has_value_ == true) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&(dst->_metas).variantSets.contained + 8));
  }
  (dst->_metas).variantSets.has_value_ = false;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  ::_M_erase(&(dst->_variantSets)._M_t,
             (_Link_type)(dst->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
  ;
  p_Var1 = &(dst->_variantSets)._M_t._M_impl.super__Rb_tree_header;
  (dst->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (dst->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (dst->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (dst->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return true;
}

Assistant:

bool VariantSelectPrimSpec(
    PrimSpec &dst, const PrimSpec &src,
    const std::map<std::string, std::string> &variant_selection,
    std::string *warn, std::string *err) {
  if (src.metas().variants && src.metas().variantSets) {
    // do variant compsotion
  } else if (src.metas().variants) {
    if (warn) {
      (*warn) +=
          "`variants` are authored, but `variantSets` is not authored.\n";
    }
    dst = src;
    dst.metas().variants.reset();
    dst.metas().variantSets.reset();
    dst.variantSets().clear();
    return true;
  } else if (src.metas().variantSets) {
    if (warn) {
      (*warn) +=
          "`variantSets` are authored, but `variants` is not authored.\n";
    }
    dst = src;
    dst.metas().variants.reset();
    dst.metas().variantSets.reset();
    dst.variantSets().clear();
    // nothing to do.
    return true;
  } else {
    dst = src;
    return true;
  }

  const auto &variantSetMeta = src.metas().variantSets.value();

  const ListEditQual qual = variantSetMeta.first;
  (void)qual;

  dst = src;

  PrimSpec ps = src;  // temp PrimSpec. Init with src.

  // Evaluate from the last element.
  for (int64_t i = int64_t(variantSetMeta.second.size()) - 1; i >= 0; i--) {
    const auto &variantSetName = variantSetMeta.second[size_t(i)];

    // 1. look into `variant_selection`.
    // 2. look into variant setting in this PrimSpec.

    std::string variantName;
    if (variant_selection.count(variantSetName)) {
      variantName = variant_selection.at(variantSetName);
    } else if (dst.current_variant_selection(variantSetName, &variantName)) {
      // ok
    } else {
      continue;
    }

    if (dst.variantSets().count(variantSetName)) {
      const auto &vss = dst.variantSets().at(variantSetName);

      if (vss.variantSet.count(variantName)) {
        const PrimSpec &vs = vss.variantSet.at(variantName);

        DCOUT(fmt::format("variantSet[{}] Select variant: {}", variantSetName,
                          variantName));

        //
        // Promote variant content to PrimSpec.
        //

        // over-like operation
        ps.metas().update_from(vs.metas(), /* override_authored */ true);

        for (const auto &prop : vs.props()) {
          DCOUT("prop: " << prop.first);
          // override existing prop
          ps.props()[prop.first] = prop.second;
        }

        for (const auto &child : vs.children()) {
          // Override if PrimSpec has same name
          // simple linear scan.
          auto it = std::find_if(ps.children().begin(), ps.children().end(),
                                 [&child](const PrimSpec &item) {
                                   return (item.name() == child.name());
                                 });

          if (it != ps.children().end()) {
            (*it) = child;  // replace
          } else {
            ps.children().push_back(child);
          }
        }

        // TODO:
        // - [ ] update `primChildren` and `properties` metadataum if required.
      }
    }
  }

  DCOUT("Variant resolved prim: " << prim::print_primspec(ps));

  // Local properties/metadatum wins against properties/metadataum from Variant
  ps.specifier() = Specifier::Over;
  if (!OverridePrimSpec(dst, ps, warn, err)) {
    PUSH_ERROR_AND_RETURN("Failed to override PrimSpec.");
  }

  dst.metas().variants.reset();
  dst.metas().variantSets.reset();
  dst.variantSets().clear();

  return true;
}